

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O0

void __thiscall docs::DocsParser::error<char_const(&)[30]>(DocsParser *this,char (*args) [30])

{
  undefined8 uVar1;
  char local_1018 [8];
  char buf [4096];
  char (*args_local) [30];
  DocsParser *this_local;
  
  buf._4088_8_ = args;
  sprintf(local_1018,*args);
  uVar1 = std::__cxx11::string::c_str();
  printf("%s:%d:%d: %s\n",uVar1,(ulong)(uint)(this->tok).pos.line,(ulong)(uint)(this->tok).pos.col,
         local_1018);
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    std::printf("%s:%d:%d: %s\n",
                data.fn.c_str(),
                tok.pos.line,
                tok.pos.col,
                buf);
    std::exit(1);
  }